

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

void Expression_Term(KonohaContext *kctx,KonohaStack *sfp)

{
  kmagicflag_t kVar1;
  size_t sVar2;
  int iVar3;
  ktypeattr_t type;
  kNameSpace *kctx_00;
  kArray *in_RSI;
  kNameSpace *in_RDI;
  int nextIdx;
  KonohaContext *unaff_retaddr;
  KClass *foundClass;
  kToken *tk;
  kNameSpace *ns;
  int endIdx;
  int opIdx;
  int beginIdx;
  kArray *tokenList;
  kNode *node;
  kSyntax *syn;
  undefined4 in_stack_ffffffffffffffa8;
  kNameSpace *ns_00;
  kToken *tk_00;
  kNode *node_00;
  KClass *pKVar4;
  
  pKVar4 = (in_RSI->h).ct;
  node_00 = (kNode *)(in_RSI->h).prototypePtr;
  kVar1 = in_RSI[1].h.magicflag;
  sVar2 = in_RSI[1].bytesize;
  iVar3 = (int)in_RSI[1].bytemax;
  (*(((PlatformApi *)(in_RDI->h).prototypePtr)->ConsoleModule).ReportDebugMessage)
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"Expression_Term",200,"tracing..");
  if ((int)sVar2 == iVar3) {
    kctx_00 = kNode_GetNameSpace((KonohaContext *)in_RDI,node_00);
    tk_00 = *(kToken **)(*(long *)(kVar1 + 0x20) + (long)iVar3 * 8);
    ns_00 = (kNameSpace *)0x0;
    type = ParseTypePattern(unaff_retaddr,in_RDI,in_RSI,(int)((ulong)pKVar4 >> 0x20),(int)pKVar4,
                            (KClass **)node_00);
    if (ns_00 == (kNameSpace *)0x0) {
      type = iVar3 + 1;
    }
    else {
      kToken_SetTypeId((KonohaContext *)kctx_00,tk_00,ns_00,type);
    }
    kNode_Termnize((KonohaContext *)ns_00,(kNode *)CONCAT44(type,in_stack_ffffffffffffffa8),
                   (kToken *)0x123e98);
    in_RSI[-2].bytemax = (long)(int)type;
  }
  else {
    in_RSI[-2].bytemax = 0xffffffffffffffff;
  }
  return;
}

Assistant:

static KMETHOD Expression_Term(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_Expression(node, tokenList, beginIdx, opIdx, endIdx);
	if(beginIdx == opIdx) {
		kNameSpace *ns = kNode_ns(node);
		kToken *tk = tokenList->TokenItems[opIdx];
		KClass *foundClass = NULL;
		int nextIdx = ParseTypePattern(kctx, ns, tokenList, beginIdx, endIdx, &foundClass);
		if(foundClass != NULL) {
			kToken_SetTypeId(kctx, tk, ns, foundClass->typeId);
		}
		else {
			nextIdx = opIdx + 1;
		}
		kNode_Termnize(kctx, node, tk);
		KReturnUnboxValue(nextIdx);
	}
	KReturnUnboxValue(-1);
}